

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

Instr * __thiscall LowererMD::LoadArgumentCount(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  RegOpnd *baseOpnd;
  IndirOpnd *newSrc;
  StackSym *pSVar4;
  Func *func;
  
  bVar2 = Func::IsLoopBody(this->m_func);
  func = this->m_func;
  if (bVar2) {
    pSVar4 = func->m_loopParamSym;
    if (pSVar4 == (StackSym *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x26f,"(this->m_func->GetLoopParamSym())",
                         "this->m_func->GetLoopParamSym()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
      func = this->m_func;
      pSVar4 = func->m_loopParamSym;
    }
    baseOpnd = IR::RegOpnd::New(pSVar4,TyInt64,func);
    newSrc = IR::IndirOpnd::New(baseOpnd,0x18,TyInt32,this->m_func,false);
  }
  else {
    pSVar4 = StackSym::New(TyVar,func);
    Func::SetArgOffset(this->m_func,pSVar4,0x18);
    newSrc = (IndirOpnd *)IR::SymOpnd::New(&pSVar4->super_Sym,TyInt64,this->m_func);
  }
  IR::Instr::SetSrc1(instr,&newSrc->super_Opnd);
  instr->m_opcode = MOV;
  return instr->m_prev;
}

Assistant:

IR::Instr *
LowererMD::LoadArgumentCount(IR::Instr * instr)
{
    if (this->m_func->IsLoopBody())
    {
        // Pull the arg count from the interpreter frame instance that was passed in.
        // (The callinfo in the loop body's frame just shows the single parameter, the interpreter frame.)
        Assert(this->m_func->GetLoopParamSym());
        IR::RegOpnd *baseOpnd = IR::RegOpnd::New(this->m_func->GetLoopParamSym(), TyMachReg, this->m_func);
        size_t offset = Js::InterpreterStackFrame::GetOffsetOfInSlotsCount();
        instr->SetSrc1(IR::IndirOpnd::New(baseOpnd, (int32)offset, TyInt32, this->m_func));
    }
    else
    {
        StackSym *sym = StackSym::New(TyVar, this->m_func);
                this->m_func->SetArgOffset(sym, (Js::JavascriptFunctionArgIndex_CallInfo - Js::JavascriptFunctionArgIndex_Frame) * sizeof(Js::Var));
        instr->SetSrc1(IR::SymOpnd::New(sym, TyMachReg,  this->m_func));
    }

    instr->m_opcode = Js::OpCode::MOV;

    return instr->m_prev;
}